

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

char * ImPlot::GetColormapName(ImPlotColormap colormap)

{
  if ((GImPlot->ColormapData).Count <= colormap) {
    return (char *)0x0;
  }
  if ((-1 < colormap) && (colormap < (GImPlot->ColormapData).TextOffsets.Size)) {
    return (GImPlot->ColormapData).Text.Buf.Data +
           (GImPlot->ColormapData).TextOffsets.Data[(uint)colormap];
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68c,"const T &ImVector<int>::operator[](int) const [T = int]");
}

Assistant:

const char* GetColormapName(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    return gp.ColormapData.GetName(colormap);
}